

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O0

void glu::parseTypePath(char *nameWithPath,VarType *type,TypeComponentVector *path)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  Token TVar4;
  deBool dVar5;
  int iVar6;
  DataType DVar7;
  TestError *pTVar8;
  StructType *pSVar9;
  StructMember *this;
  char *__rhs;
  VarTypeComponent local_a8;
  VarTypeComponent local_a0;
  VarTypeComponent local_98;
  int local_90;
  int ndx_1;
  int local_84;
  undefined1 local_80 [4];
  int ndx;
  string memberName;
  VarType curType;
  undefined1 local_38 [8];
  VarTokenizer tokenizer;
  TypeComponentVector *path_local;
  VarType *type_local;
  char *nameWithPath_local;
  
  tokenizer._16_8_ = path;
  VarTokenizer::VarTokenizer((VarTokenizer *)local_38,nameWithPath);
  TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38);
  if (TVar4 == TOKEN_IDENTIFIER) {
    VarTokenizer::advance((VarTokenizer *)local_38);
  }
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::clear
            ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
             tokenizer._16_8_);
  do {
    TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38);
    if (TVar4 == TOKEN_END) {
      VarTokenizer::~VarTokenizer((VarTokenizer *)local_38);
      return;
    }
    getVarType((VarType *)((long)&memberName.field_2 + 8),type,
               (TypeComponentVector *)tokenizer._16_8_);
    TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38);
    if (TVar4 == TOKEN_PERIOD) {
      VarTokenizer::advance((VarTokenizer *)local_38);
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) ||
           (TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38), TVar4 != TOKEN_IDENTIFIER)) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x70);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) ||
           (bVar3 = VarType::isStructType((VarType *)((long)&memberName.field_2 + 8)), !bVar3)) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Invalid field selector","curType.isStructType()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x71);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      VarTokenizer::getIdentifier_abi_cxx11_((string *)local_80,(VarTokenizer *)local_38);
      local_84 = 0;
      while( true ) {
        iVar1 = local_84;
        pSVar9 = VarType::getStructPtr((VarType *)((long)&memberName.field_2 + 8));
        iVar6 = StructType::getNumMembers(pSVar9);
        if (iVar6 <= iVar1) break;
        pSVar9 = VarType::getStructPtr((VarType *)((long)&memberName.field_2 + 8));
        this = StructType::getMember(pSVar9,local_84);
        __rhs = StructMember::getName(this);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,__rhs);
        if (bVar3) break;
        local_84 = local_84 + 1;
      }
      do {
        dVar5 = ::deGetFalse();
        iVar1 = local_84;
        if (dVar5 != 0) {
LAB_010540dc:
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Member not found in type",
                     "ndx < curType.getStructPtr()->getNumMembers()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x7b);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pSVar9 = VarType::getStructPtr((VarType *)((long)&memberName.field_2 + 8));
        iVar6 = StructType::getNumMembers(pSVar9);
        if (iVar6 <= iVar1) goto LAB_010540dc;
        dVar5 = ::deGetFalse();
        uVar2 = tokenizer._16_8_;
      } while (dVar5 != 0);
      VarTypeComponent::VarTypeComponent
                ((VarTypeComponent *)&stack0xffffffffffffff74,STRUCT_MEMBER,local_84);
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)uVar2,
                 (value_type *)&stack0xffffffffffffff74);
      VarTokenizer::advance((VarTokenizer *)local_38);
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38);
      if (TVar4 != TOKEN_LEFT_BRACKET) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Unexpected token",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x9e);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      VarTokenizer::advance((VarTokenizer *)local_38);
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) ||
           (TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38), TVar4 != TOKEN_NUMBER)) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x83);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      local_90 = VarTokenizer::getNumber((VarTokenizer *)local_38);
      bVar3 = VarType::isArrayType((VarType *)((long)&memberName.field_2 + 8));
      if (bVar3) {
        do {
          dVar5 = ::deGetFalse();
          iVar1 = local_90;
          if (dVar5 != 0) {
LAB_01054352:
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"de::inBounds(ndx, 0, curType.getArraySize())",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x89);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          iVar6 = VarType::getArraySize((VarType *)((long)&memberName.field_2 + 8));
          bVar3 = de::inBounds<int>(iVar1,0,iVar6);
          if (!bVar3) goto LAB_01054352;
          dVar5 = ::deGetFalse();
          uVar2 = tokenizer._16_8_;
        } while (dVar5 != 0);
        VarTypeComponent::VarTypeComponent(&local_98,ARRAY_ELEMENT,local_90);
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                  ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)uVar2,
                   &local_98);
      }
      else {
        bVar3 = VarType::isBasicType((VarType *)((long)&memberName.field_2 + 8));
        if (bVar3) {
          DVar7 = VarType::getBasicType((VarType *)((long)&memberName.field_2 + 8));
          bVar3 = isDataTypeMatrix(DVar7);
          if (bVar3) {
            do {
              dVar5 = ::deGetFalse();
              iVar1 = local_90;
              if (dVar5 != 0) {
LAB_010544e4:
                pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar8,(char *)0x0,
                           "de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType()))"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                           ,0x8e);
                __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              DVar7 = VarType::getBasicType((VarType *)((long)&memberName.field_2 + 8));
              iVar6 = getDataTypeMatrixNumColumns(DVar7);
              bVar3 = de::inBounds<int>(iVar1,0,iVar6);
              if (!bVar3) goto LAB_010544e4;
              dVar5 = ::deGetFalse();
              uVar2 = tokenizer._16_8_;
            } while (dVar5 != 0);
            VarTypeComponent::VarTypeComponent(&local_a0,MATRIX_COLUMN,local_90);
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                      ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)
                       uVar2,&local_a0);
            goto LAB_010547b7;
          }
        }
        bVar3 = VarType::isBasicType((VarType *)((long)&memberName.field_2 + 8));
        if (!bVar3) {
LAB_01054741:
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Invalid subscript",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x97);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        DVar7 = VarType::getBasicType((VarType *)((long)&memberName.field_2 + 8));
        bVar3 = isDataTypeVector(DVar7);
        if (!bVar3) goto LAB_01054741;
        do {
          dVar5 = ::deGetFalse();
          iVar1 = local_90;
          if (dVar5 != 0) {
LAB_01054676:
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,
                       "de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType()))",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x93);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          DVar7 = VarType::getBasicType((VarType *)((long)&memberName.field_2 + 8));
          iVar6 = getDataTypeScalarSize(DVar7);
          bVar3 = de::inBounds<int>(iVar1,0,iVar6);
          if (!bVar3) goto LAB_01054676;
          dVar5 = ::deGetFalse();
          uVar2 = tokenizer._16_8_;
        } while (dVar5 != 0);
        VarTypeComponent::VarTypeComponent(&local_a8,VECTOR_COMPONENT,local_90);
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                  ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)uVar2,
                   &local_a8);
      }
LAB_010547b7:
      VarTokenizer::advance((VarTokenizer *)local_38);
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) ||
           (TVar4 = VarTokenizer::getToken((VarTokenizer *)local_38), TVar4 != TOKEN_RIGHT_BRACKET))
        {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x9a);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      VarTokenizer::advance((VarTokenizer *)local_38);
    }
    VarType::~VarType((VarType *)((long)&memberName.field_2 + 8));
  } while( true );
}

Assistant:

void parseTypePath (const char* nameWithPath, const VarType& type, TypeComponentVector& path)
{
	VarTokenizer tokenizer(nameWithPath);

	if (tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER)
		tokenizer.advance();

	path.clear();
	while (tokenizer.getToken() != VarTokenizer::TOKEN_END)
	{
		VarType curType = getVarType(type, path);

		if (tokenizer.getToken() == VarTokenizer::TOKEN_PERIOD)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
			TCU_CHECK_MSG(curType.isStructType(), "Invalid field selector");

			// Find member.
			std::string		memberName	= tokenizer.getIdentifier();
			int				ndx			= 0;
			for (; ndx < curType.getStructPtr()->getNumMembers(); ndx++)
			{
				if (memberName == curType.getStructPtr()->getMember(ndx).getName())
					break;
			}
			TCU_CHECK_MSG(ndx < curType.getStructPtr()->getNumMembers(), "Member not found in type");

			path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, ndx));
			tokenizer.advance();
		}
		else if (tokenizer.getToken() == VarTokenizer::TOKEN_LEFT_BRACKET)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER);

			int ndx = tokenizer.getNumber();

			if (curType.isArrayType())
			{
				TCU_CHECK(de::inBounds(ndx, 0, curType.getArraySize()));
				path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, ndx));
			}
			else if (curType.isBasicType() && isDataTypeMatrix(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, ndx));
			}
			else if (curType.isBasicType() && isDataTypeVector(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, ndx));
			}
			else
				TCU_FAIL("Invalid subscript");

			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET);
			tokenizer.advance();
		}
		else
			TCU_FAIL("Unexpected token");
	}
}